

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O3

void av1_fwd_txfm2d_16x8_sse4_1(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  code *pcVar1;
  code *pcVar2;
  undefined8 uVar3;
  long lVar4;
  int8_t *piVar5;
  bool bVar6;
  ulong uVar7;
  undefined8 *puVar8;
  undefined7 in_register_00000009;
  undefined1 (*pauVar9) [16];
  int *piVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  int iVar16;
  undefined1 (*pauVar17) [16];
  int *piVar18;
  long lVar19;
  long lVar20;
  undefined1 (*pauVar21) [16];
  bool bVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  __m128i round;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  int iVar35;
  int iVar38;
  int iVar39;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  int iVar40;
  undefined1 in_XMM9 [16];
  undefined1 auVar41 [16];
  __m128i in [32];
  __m128i out [32];
  int local_448 [4];
  undefined1 local_438 [16];
  undefined1 local_428 [16];
  int local_418;
  int iStack_414;
  int iStack_410;
  int iStack_40c;
  int local_408;
  int iStack_404;
  int iStack_400;
  int iStack_3fc;
  undefined1 local_3f8 [16];
  int local_3e8;
  int iStack_3e4;
  int iStack_3e0;
  int iStack_3dc;
  undefined1 local_3d8 [16];
  int local_3c8;
  int iStack_3c4;
  int iStack_3c0;
  int iStack_3bc;
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  int local_388;
  int iStack_384;
  int iStack_380;
  int iStack_37c;
  undefined1 local_378 [16];
  int local_368;
  int iStack_364;
  int iStack_360;
  int iStack_35c;
  int local_358;
  int iStack_354;
  int iStack_350;
  int iStack_34c;
  undefined8 local_268 [4];
  int local_248;
  int iStack_244;
  int iStack_240;
  int iStack_23c;
  int local_238 [2];
  undefined8 uStack_230;
  int local_228 [2];
  undefined8 auStack_220 [2];
  int aiStack_210 [10];
  undefined8 uStack_1e8;
  int aiStack_1e0 [6];
  undefined8 uStack_1c8;
  int aiStack_1b8 [2];
  undefined8 auStack_1b0 [4];
  int aiStack_190 [10];
  undefined8 uStack_168;
  int aiStack_160 [6];
  undefined8 uStack_148;
  int local_138 [66];
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM1_Qb;
  
  piVar5 = av1_fwd_txfm_shift_ls[8];
  uVar7 = (ulong)(uint)((int)CONCAT71(in_register_00000009,tx_type) << 3);
  bVar23 = 0xf < tx_type;
  uVar14 = 0xbeaf >> (tx_type & 0x1f);
  bVar6 = (uVar14 & 1) != 0;
  lVar13 = (long)(stride * 6);
  if (bVar6 || bVar23) {
    lVar13 = (long)stride;
  }
  lVar19 = (long)(stride * 2);
  lVar11 = (long)stride;
  lVar4 = (long)(stride * 5);
  if (bVar6 || bVar23) {
    lVar19 = (long)(stride * 5);
    lVar11 = (long)(stride * 6);
    lVar4 = (long)(stride * 2);
  }
  lVar20 = (long)(stride * 4);
  if (bVar6 || bVar23) {
    lVar20 = (long)(stride * 3);
  }
  pcVar1 = *(code **)((long)col_highbd_txfm8x8_arr + uVar7);
  lVar12 = (long)(stride * 3);
  if (bVar6 || bVar23) {
    lVar12 = (long)(stride * 4);
  }
  pcVar2 = *(code **)((long)row_highbd_txfm8x16_arr + uVar7);
  lVar15 = 0;
  bVar6 = true;
  do {
    bVar22 = bVar6;
    pauVar9 = (undefined1 (*) [16])(input + lVar15 * 8);
    bVar6 = (uVar14 & 1) != 0;
    pauVar17 = (undefined1 (*) [16])(*pauVar9 + (long)(stride * 7) * 2);
    if (bVar6 || bVar23) {
      pauVar17 = pauVar9;
    }
    local_358 = (int)*piVar5;
    pauVar21 = (undefined1 (*) [16])(*pauVar9 + (long)(stride * 7) * 2);
    if (!bVar6 && !bVar23) {
      pauVar21 = pauVar9;
    }
    auVar26 = *(undefined1 (*) [16])(*pauVar9 + lVar12 * 2);
    auVar27 = *(undefined1 (*) [16])(*pauVar9 + lVar19 * 2);
    auVar29 = *(undefined1 (*) [16])(*pauVar9 + lVar11 * 2);
    auVar31 = *(undefined1 (*) [16])(*pauVar9 + lVar20 * 2);
    auVar32 = *(undefined1 (*) [16])(*pauVar9 + lVar4 * 2);
    auVar34 = *(undefined1 (*) [16])(*pauVar9 + lVar13 * 2);
    auVar37 = *pauVar17;
    auVar24 = *pauVar21;
    auVar41 = pmovsxwd(in_XMM9,auVar37);
    local_448[0] = auVar41._0_4_ << local_358;
    local_448[1] = auVar41._4_4_;
    local_448[2] = auVar41._8_4_;
    local_448[3] = auVar41._12_4_;
    auVar36._8_4_ = auVar37._8_4_;
    auVar36._12_4_ = auVar37._12_4_;
    auVar36._0_8_ = auVar37._8_8_;
    auVar37 = pmovsxwd(auVar36,auVar36);
    local_438._0_4_ = auVar37._0_4_ << local_358;
    local_438._4_4_ = auVar37._4_4_;
    local_438._8_4_ = auVar37._8_4_;
    local_438._12_4_ = auVar37._12_4_;
    auVar37 = pmovsxwd(local_438,auVar34);
    local_428._0_4_ = auVar37._0_4_ << local_358;
    local_428._4_4_ = auVar37._4_4_;
    local_428._8_4_ = auVar37._8_4_;
    local_428._12_4_ = auVar37._12_4_;
    auVar37 = pmovsxwd(local_428,auVar32);
    auVar33._8_4_ = auVar34._8_4_;
    auVar33._12_4_ = auVar34._12_4_;
    auVar33._0_8_ = auVar34._8_8_;
    auVar34 = pmovsxwd(auVar33,auVar33);
    local_418 = auVar34._0_4_ << local_358;
    iStack_414 = auVar34._4_4_;
    iStack_410 = auVar34._8_4_;
    iStack_40c = auVar34._12_4_;
    local_408 = auVar37._0_4_ << local_358;
    iStack_404 = auVar37._4_4_;
    iStack_400 = auVar37._8_4_;
    iStack_3fc = auVar37._12_4_;
    auVar41._8_4_ = auVar32._8_4_;
    auVar41._12_4_ = auVar32._12_4_;
    auVar41._0_8_ = auVar32._8_8_;
    auVar32 = pmovsxwd(auVar41,auVar41);
    local_3f8._0_4_ = auVar32._0_4_ << local_358;
    local_3f8._4_4_ = auVar32._4_4_;
    local_3f8._8_4_ = auVar32._8_4_;
    local_3f8._12_4_ = auVar32._12_4_;
    auVar32 = pmovsxwd(local_3f8,auVar31);
    local_3e8 = auVar32._0_4_ << local_358;
    iStack_3e4 = auVar32._4_4_;
    iStack_3e0 = auVar32._8_4_;
    iStack_3dc = auVar32._12_4_;
    auVar37._8_4_ = auVar31._8_4_;
    auVar37._12_4_ = auVar31._12_4_;
    auVar37._0_8_ = auVar31._8_8_;
    auVar31 = pmovsxwd(auVar37,auVar37);
    local_3d8._0_4_ = auVar31._0_4_ << local_358;
    local_3d8._4_4_ = auVar31._4_4_;
    local_3d8._8_4_ = auVar31._8_4_;
    local_3d8._12_4_ = auVar31._12_4_;
    auVar31 = pmovsxwd(local_3d8,auVar26);
    local_3c8 = auVar31._0_4_ << local_358;
    iStack_3c4 = auVar31._4_4_;
    iStack_3c0 = auVar31._8_4_;
    iStack_3bc = auVar31._12_4_;
    auVar32._8_4_ = auVar26._8_4_;
    auVar32._12_4_ = auVar26._12_4_;
    auVar32._0_8_ = auVar26._8_8_;
    auVar26 = pmovsxwd(auVar32,auVar32);
    local_3b8._0_4_ = auVar26._0_4_ << local_358;
    local_3b8._4_4_ = auVar26._4_4_;
    local_3b8._8_4_ = auVar26._8_4_;
    local_3b8._12_4_ = auVar26._12_4_;
    auVar32 = pmovsxwd(local_3b8,auVar27);
    auVar31._8_4_ = auVar27._8_4_;
    auVar31._12_4_ = auVar27._12_4_;
    auVar31._0_8_ = auVar27._8_8_;
    auVar26 = pmovsxwd(auVar31,auVar31);
    local_3a8._0_4_ = auVar32._0_4_ << local_358;
    local_3a8._4_4_ = auVar32._4_4_;
    local_3a8._8_4_ = auVar32._8_4_;
    local_3a8._12_4_ = auVar32._12_4_;
    auVar27 = pmovsxwd(local_3a8,auVar29);
    local_388 = auVar27._0_4_ << local_358;
    iStack_384 = auVar27._4_4_;
    iStack_380 = auVar27._8_4_;
    iStack_37c = auVar27._12_4_;
    local_398._4_4_ = auVar26._4_4_;
    local_398._0_4_ = auVar26._0_4_ << local_358;
    local_398._8_4_ = auVar26._8_4_;
    local_398._12_4_ = auVar26._12_4_;
    auVar27._8_4_ = auVar29._8_4_;
    auVar27._12_4_ = auVar29._12_4_;
    auVar27._0_8_ = auVar29._8_8_;
    auVar26 = pmovsxwd(auVar27,auVar27);
    local_378._0_4_ = auVar26._0_4_ << local_358;
    local_378._4_4_ = auVar26._4_4_;
    local_378._8_4_ = auVar26._8_4_;
    local_378._12_4_ = auVar26._12_4_;
    auVar26 = pmovsxwd(local_378,auVar24);
    local_368 = auVar26._0_4_ << local_358;
    iStack_364 = auVar26._4_4_;
    iStack_360 = auVar26._8_4_;
    iStack_35c = auVar26._12_4_;
    auVar26._8_4_ = auVar24._8_4_;
    auVar26._12_4_ = auVar24._12_4_;
    auVar26._0_8_ = auVar24._8_8_;
    auVar26 = pmovsxwd(auVar26,auVar26);
    local_358 = auVar26._0_4_ << local_358;
    iStack_354 = auVar26._4_4_;
    iStack_350 = auVar26._8_4_;
    iStack_34c = auVar26._12_4_;
    (*pcVar1)(local_448,local_448,0xd,2);
    iVar16 = 1 << (~piVar5[1] & 0x1fU);
    auVar26 = ZEXT416((uint)-(int)piVar5[1]);
    local_448[0] = local_448[0] + iVar16 >> auVar26;
    local_448[1] = local_448[1] + iVar16 >> auVar26;
    local_448[2] = local_448[2] + iVar16 >> auVar26;
    local_448[3] = local_448[3] + iVar16 >> auVar26;
    local_438._0_4_ = local_438._0_4_ + iVar16 >> auVar26;
    local_438._4_4_ = local_438._4_4_ + iVar16 >> auVar26;
    local_438._8_4_ = local_438._8_4_ + iVar16 >> auVar26;
    local_438._12_4_ = local_438._12_4_ + iVar16 >> auVar26;
    local_428._0_4_ = local_428._0_4_ + iVar16 >> auVar26;
    local_428._4_4_ = local_428._4_4_ + iVar16 >> auVar26;
    local_428._8_4_ = local_428._8_4_ + iVar16 >> auVar26;
    local_428._12_4_ = local_428._12_4_ + iVar16 >> auVar26;
    local_418 = local_418 + iVar16 >> auVar26;
    iStack_414 = iStack_414 + iVar16 >> auVar26;
    iStack_410 = iStack_410 + iVar16 >> auVar26;
    iStack_40c = iStack_40c + iVar16 >> auVar26;
    local_408 = local_408 + iVar16 >> auVar26;
    iStack_404 = iStack_404 + iVar16 >> auVar26;
    iStack_400 = iStack_400 + iVar16 >> auVar26;
    iStack_3fc = iStack_3fc + iVar16 >> auVar26;
    local_3f8._0_4_ = local_3f8._0_4_ + iVar16 >> auVar26;
    local_3f8._4_4_ = local_3f8._4_4_ + iVar16 >> auVar26;
    local_3f8._8_4_ = local_3f8._8_4_ + iVar16 >> auVar26;
    local_3f8._12_4_ = local_3f8._12_4_ + iVar16 >> auVar26;
    local_3e8 = local_3e8 + iVar16 >> auVar26;
    iStack_3e4 = iStack_3e4 + iVar16 >> auVar26;
    iStack_3e0 = iStack_3e0 + iVar16 >> auVar26;
    iStack_3dc = iStack_3dc + iVar16 >> auVar26;
    local_3d8._0_4_ = local_3d8._0_4_ + iVar16 >> auVar26;
    local_3d8._4_4_ = local_3d8._4_4_ + iVar16 >> auVar26;
    local_3d8._8_4_ = local_3d8._8_4_ + iVar16 >> auVar26;
    local_3d8._12_4_ = local_3d8._12_4_ + iVar16 >> auVar26;
    local_3c8 = local_3c8 + iVar16 >> auVar26;
    iStack_3c4 = iStack_3c4 + iVar16 >> auVar26;
    iStack_3c0 = iStack_3c0 + iVar16 >> auVar26;
    iStack_3bc = iStack_3bc + iVar16 >> auVar26;
    local_3b8._0_4_ = local_3b8._0_4_ + iVar16 >> auVar26;
    local_3b8._4_4_ = local_3b8._4_4_ + iVar16 >> auVar26;
    local_3b8._8_4_ = local_3b8._8_4_ + iVar16 >> auVar26;
    local_3b8._12_4_ = local_3b8._12_4_ + iVar16 >> auVar26;
    local_248 = local_3a8._0_4_ + iVar16 >> auVar26;
    iStack_244 = local_3a8._4_4_ + iVar16 >> auVar26;
    iStack_240 = local_3a8._8_4_ + iVar16 >> auVar26;
    iStack_23c = local_3a8._12_4_ + iVar16 >> auVar26;
    iVar35 = local_398._0_4_ + iVar16 >> auVar26;
    iVar38 = local_398._4_4_ + iVar16 >> auVar26;
    iVar39 = local_398._8_4_ + iVar16 >> auVar26;
    iVar40 = local_398._12_4_ + iVar16 >> auVar26;
    local_388 = local_388 + iVar16 >> auVar26;
    iStack_384 = iStack_384 + iVar16 >> auVar26;
    iStack_380 = iStack_380 + iVar16 >> auVar26;
    iStack_37c = iStack_37c + iVar16 >> auVar26;
    local_378._0_4_ = local_378._0_4_ + iVar16 >> auVar26;
    local_378._4_4_ = local_378._4_4_ + iVar16 >> auVar26;
    local_378._8_4_ = local_378._8_4_ + iVar16 >> auVar26;
    local_378._12_4_ = local_378._12_4_ + iVar16 >> auVar26;
    local_368 = local_368 + iVar16 >> auVar26;
    iStack_364 = iStack_364 + iVar16 >> auVar26;
    iStack_360 = iStack_360 + iVar16 >> auVar26;
    iStack_35c = iStack_35c + iVar16 >> auVar26;
    local_358 = iVar16 + local_358 >> auVar26;
    iStack_354 = iVar16 + iStack_354 >> auVar26;
    iStack_350 = iVar16 + iStack_350 >> auVar26;
    iStack_34c = iVar16 + iStack_34c >> auVar26;
    *(ulong *)(local_238 + lVar15 * 0x40) = CONCAT44(local_428._0_4_,local_448[0]);
    *(ulong *)(local_238 + lVar15 * 0x40 + 2) = CONCAT44(local_3e8,local_408);
    aiStack_210[lVar15 * 0x40] = local_448[1];
    aiStack_210[lVar15 * 0x40 + 1] = local_428._4_4_;
    aiStack_210[lVar15 * 0x40 + 2] = iStack_404;
    aiStack_210[lVar15 * 0x40 + 3] = iStack_3e4;
    aiStack_210[lVar15 * 0x40 + 6] = local_448[2];
    aiStack_210[lVar15 * 0x40 + 7] = local_428._8_4_;
    aiStack_210[lVar15 * 0x40 + 8] = iStack_400;
    aiStack_210[lVar15 * 0x40 + 9] = iStack_3e0;
    aiStack_1e0[lVar15 * 0x40 + 4] = local_448[3];
    aiStack_1e0[lVar15 * 0x40 + 5] = local_428._12_4_;
    *(int *)(&uStack_1c8 + lVar15 * 0x20) = iStack_3fc;
    *(int *)((long)&uStack_1c8 + lVar15 * 0x100 + 4) = iStack_3dc;
    *(ulong *)(aiStack_1b8 + lVar15 * 0x40) = CONCAT44(local_418,local_438._0_4_);
    auStack_1b0[lVar15 * 0x20] = CONCAT44(local_3d8._0_4_,local_3f8._0_4_);
    aiStack_190[lVar15 * 0x40] = local_438._4_4_;
    aiStack_190[lVar15 * 0x40 + 1] = iStack_414;
    aiStack_190[lVar15 * 0x40 + 2] = local_3f8._4_4_;
    aiStack_190[lVar15 * 0x40 + 3] = local_3d8._4_4_;
    aiStack_190[lVar15 * 0x40 + 6] = local_438._8_4_;
    aiStack_190[lVar15 * 0x40 + 7] = iStack_410;
    aiStack_190[lVar15 * 0x40 + 8] = local_3f8._8_4_;
    aiStack_190[lVar15 * 0x40 + 9] = local_3d8._8_4_;
    local_3a8._4_4_ = iStack_244;
    local_3a8._0_4_ = local_248;
    local_3a8._8_4_ = iStack_240;
    local_3a8._12_4_ = iStack_23c;
    in_XMM9._4_4_ = iVar38;
    in_XMM9._0_4_ = iVar35;
    in_XMM9._8_4_ = iVar39;
    in_XMM9._12_4_ = iVar40;
    aiStack_160[lVar15 * 0x40 + 4] = local_438._12_4_;
    aiStack_160[lVar15 * 0x40 + 5] = iStack_40c;
    *(undefined4 *)(&uStack_148 + lVar15 * 0x20) = local_3f8._12_4_;
    *(undefined4 *)((long)&uStack_148 + lVar15 * 0x100 + 4) = local_3d8._12_4_;
    auVar34._0_8_ = CONCAT44(iStack_240,iStack_3c0);
    auVar34._8_4_ = iStack_3bc;
    auVar34._12_4_ = iStack_23c;
    *(ulong *)(local_238 + lVar15 * 0x40 + 4) = CONCAT44(local_248,local_3c8);
    *(ulong *)(aiStack_210 + lVar15 * 0x40 + -4) = CONCAT44(local_368,local_388);
    aiStack_210[lVar15 * 0x40 + 4] = iStack_3c4;
    aiStack_210[lVar15 * 0x40 + 5] = iStack_244;
    aiStack_210[lVar15 * 0x40 + 6] = iStack_384;
    aiStack_210[lVar15 * 0x40 + 7] = iStack_364;
    (&uStack_1e8)[lVar15 * 0x20] = auVar34._0_8_;
    aiStack_1e0[lVar15 * 0x40] = iStack_380;
    aiStack_1e0[lVar15 * 0x40 + 1] = iStack_360;
    (&uStack_1c8)[lVar15 * 0x20] = auVar34._8_8_;
    aiStack_1b8[lVar15 * 0x40] = iStack_37c;
    aiStack_1b8[lVar15 * 0x40 + 1] = iStack_35c;
    auVar29._0_8_ = CONCAT44(iVar39,local_3b8._8_4_);
    auVar29._8_4_ = local_3b8._12_4_;
    auVar29._12_4_ = iVar40;
    auStack_1b0[lVar15 * 0x20 + 1] = CONCAT44(iVar35,local_3b8._0_4_);
    auStack_1b0[lVar15 * 0x20 + 2] = CONCAT44(local_358,local_378._0_4_);
    aiStack_190[lVar15 * 0x40 + 4] = local_3b8._4_4_;
    aiStack_190[lVar15 * 0x40 + 5] = iVar38;
    aiStack_190[lVar15 * 0x40 + 6] = local_378._4_4_;
    aiStack_190[lVar15 * 0x40 + 7] = iStack_354;
    (&uStack_168)[lVar15 * 0x20] = auVar29._0_8_;
    aiStack_160[lVar15 * 0x40] = local_378._8_4_;
    aiStack_160[lVar15 * 0x40 + 1] = iStack_350;
    (&uStack_148)[lVar15 * 0x20] = auVar29._8_8_;
    local_138[lVar15 * 0x40] = local_378._12_4_;
    local_138[lVar15 * 0x40 + 1] = iStack_34c;
    lVar15 = 1;
    bVar6 = false;
  } while (bVar22);
  piVar10 = local_238;
  if ((0x7f1fU >> (tx_type & 0x1f) & 1) == 0 && !bVar23) {
    uVar7 = 0xfffffffffffffffe;
    piVar10 = local_238;
    puVar8 = local_268;
    do {
      uVar3 = *(undefined8 *)(piVar10 + 2);
      *puVar8 = *(undefined8 *)piVar10;
      puVar8[1] = uVar3;
      uVar7 = uVar7 + 2;
      puVar8 = puVar8 + -4;
      piVar10 = piVar10 + 8;
    } while (uVar7 < 0x1e);
    puVar8 = local_268 + 2;
    uVar7 = 0xffffffffffffffff;
    piVar18 = local_238 + 4;
    do {
      uVar3 = *(undefined8 *)(piVar18 + 2);
      *puVar8 = *(undefined8 *)piVar18;
      puVar8[1] = uVar3;
      uVar7 = uVar7 + 2;
      puVar8 = puVar8 + -4;
      piVar18 = piVar18 + 8;
      piVar10 = local_448;
    } while (uVar7 < 0x1e);
  }
  local_398 = in_XMM9;
  auVar26 = (*pcVar2)(piVar10,local_238,0xd,2);
  auVar25._0_8_ = auVar26._8_8_;
  auVar24._0_8_ = auVar26._0_8_;
  auVar25._8_8_ = extraout_XMM1_Qb;
  auVar24._8_8_ = extraout_XMM0_Qb;
  lVar13 = 0;
  auVar26 = pmovsxwd(auVar24,0x16a116a116a116a1);
  auVar27 = pmovsxwd(auVar25,0x800080008000800);
  piVar10 = local_238;
  bVar6 = true;
  do {
    bVar23 = bVar6;
    iVar16 = (int)piVar5[2];
    if (iVar16 < 0) {
      iVar35 = 1 << (~piVar5[2] & 0x1fU);
      auVar29 = ZEXT416((uint)-iVar16);
      lVar11 = 0;
      do {
        piVar18 = (int *)((long)piVar10 + lVar11);
        auVar30._0_4_ = *piVar18 + iVar35 >> auVar29;
        auVar30._4_4_ = piVar18[1] + iVar35 >> auVar29;
        auVar30._8_4_ = piVar18[2] + iVar35 >> auVar29;
        auVar30._12_4_ = piVar18[3] + iVar35 >> auVar29;
        auVar31 = pmulld(auVar30,auVar26);
        *(int *)((long)local_448 + lVar11) = auVar31._0_4_ + auVar27._0_4_ >> 0xc;
        *(int *)((long)local_448 + lVar11 + 4) = auVar31._4_4_ + auVar27._4_4_ >> 0xc;
        *(int *)((long)local_448 + lVar11 + 8) = auVar31._8_4_ + auVar27._8_4_ >> 0xc;
        *(int *)(local_438 + lVar11 + -4) = auVar31._12_4_ + auVar27._12_4_ >> 0xc;
        lVar11 = lVar11 + 0x10;
      } while (lVar11 != 0x100);
    }
    else {
      lVar11 = 0;
      do {
        piVar18 = (int *)((long)piVar10 + lVar11);
        auVar28._0_4_ = *piVar18 << iVar16;
        auVar28._4_4_ = piVar18[1];
        auVar28._8_4_ = piVar18[2];
        auVar28._12_4_ = piVar18[3];
        auVar29 = pmulld(auVar28,auVar26);
        *(int *)((long)local_448 + lVar11) = auVar29._0_4_ + auVar27._0_4_ >> 0xc;
        *(int *)((long)local_448 + lVar11 + 4) = auVar29._4_4_ + auVar27._4_4_ >> 0xc;
        *(int *)((long)local_448 + lVar11 + 8) = auVar29._8_4_ + auVar27._8_4_ >> 0xc;
        *(int *)(local_438 + lVar11 + -4) = auVar29._12_4_ + auVar27._12_4_ >> 0xc;
        lVar11 = lVar11 + 0x10;
      } while (lVar11 != 0x100);
    }
    *(undefined8 *)((long)coeff + lVar13) = CONCAT44(local_448[1],local_448[0]);
    ((undefined8 *)((long)coeff + lVar13))[1] = CONCAT44(local_448[3],local_448[2]);
    puVar8 = (undefined8 *)((long)coeff + lVar13 + 0x10);
    *puVar8 = local_438._0_8_;
    puVar8[1] = local_438._8_8_;
    puVar8 = (undefined8 *)((long)coeff + lVar13 + 0x20);
    *puVar8 = local_428._0_8_;
    puVar8[1] = local_428._8_8_;
    puVar8 = (undefined8 *)((long)coeff + lVar13 + 0x30);
    *puVar8 = CONCAT44(iStack_414,local_418);
    puVar8[1] = CONCAT44(iStack_40c,iStack_410);
    puVar8 = (undefined8 *)((long)coeff + lVar13 + 0x40);
    *puVar8 = CONCAT44(iStack_404,local_408);
    puVar8[1] = CONCAT44(iStack_3fc,iStack_400);
    puVar8 = (undefined8 *)((long)coeff + lVar13 + 0x50);
    *puVar8 = local_3f8._0_8_;
    puVar8[1] = local_3f8._8_8_;
    puVar8 = (undefined8 *)((long)coeff + lVar13 + 0x60);
    *puVar8 = CONCAT44(iStack_3e4,local_3e8);
    puVar8[1] = CONCAT44(iStack_3dc,iStack_3e0);
    puVar8 = (undefined8 *)((long)coeff + lVar13 + 0x70);
    *puVar8 = local_3d8._0_8_;
    puVar8[1] = local_3d8._8_8_;
    puVar8 = (undefined8 *)((long)coeff + lVar13 + 0x80);
    *puVar8 = CONCAT44(iStack_3c4,local_3c8);
    puVar8[1] = CONCAT44(iStack_3bc,iStack_3c0);
    puVar8 = (undefined8 *)((long)coeff + lVar13 + 0x90);
    *puVar8 = local_3b8._0_8_;
    puVar8[1] = local_3b8._8_8_;
    puVar8 = (undefined8 *)((long)coeff + lVar13 + 0xa0);
    *puVar8 = local_3a8._0_8_;
    puVar8[1] = local_3a8._8_8_;
    puVar8 = (undefined8 *)((long)coeff + lVar13 + 0xb0);
    *puVar8 = local_398._0_8_;
    puVar8[1] = local_398._8_8_;
    puVar8 = (undefined8 *)((long)coeff + lVar13 + 0xc0);
    *puVar8 = CONCAT44(iStack_384,local_388);
    puVar8[1] = CONCAT44(iStack_37c,iStack_380);
    puVar8 = (undefined8 *)((long)coeff + lVar13 + 0xd0);
    *puVar8 = local_378._0_8_;
    puVar8[1] = local_378._8_8_;
    puVar8 = (undefined8 *)((long)coeff + lVar13 + 0xe0);
    *puVar8 = CONCAT44(iStack_364,local_368);
    puVar8[1] = CONCAT44(iStack_35c,iStack_360);
    puVar8 = (undefined8 *)((long)coeff + lVar13 + 0xf0);
    *puVar8 = CONCAT44(iStack_354,local_358);
    puVar8[1] = CONCAT44(iStack_34c,iStack_350);
    lVar13 = 0x100;
    piVar10 = local_138;
    bVar6 = false;
  } while (bVar23);
  return;
}

Assistant:

void av1_fwd_txfm2d_16x8_sse4_1(const int16_t *input, int32_t *coeff,
                                int stride, TX_TYPE tx_type, int bd) {
  __m128i in[32], out[32];
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_16X8];
  const int txw_idx = get_txw_idx(TX_16X8);
  const int txh_idx = get_txh_idx(TX_16X8);
  const fwd_transform_1d_sse4_1 col_txfm = col_highbd_txfm8x8_arr[tx_type];
  const fwd_transform_1d_sse4_1 row_txfm = row_highbd_txfm8x16_arr[tx_type];
  int bit = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);

  for (int i = 0; i < 2; i++) {
    load_buffer_8x8(input + i * 8, in, stride, ud_flip, 0, shift[0]);
    col_txfm(in, in, bit, 2);
    col_txfm_8x8_rounding(in, -shift[1]);
    transpose_8x8(in, out + i * 16);
  }

  if (lr_flip) {
    flip_buf_sse4_1(in, out, 32);
    row_txfm(in, out, bit, 2);
  } else {
    row_txfm(out, out, bit, 2);
  }

  for (int i = 0; i < 2; i++) {
    av1_round_shift_rect_array_32_sse4_1(out + i * 16, in, 16, -shift[2],
                                         NewSqrt2);
    write_buffer_8x8(in, coeff + i * 64);
  }
  (void)bd;
}